

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArbitraryInteger.cpp
# Opt level: O0

div_t __thiscall Refal2::CArbitraryInteger::div(CArbitraryInteger *this,int __numer,int __denom)

{
  bool bVar1;
  TCompareResult TVar2;
  div_t extraout_RAX;
  div_t extraout_RAX_00;
  div_t extraout_RAX_01;
  div_t extraout_RAX_02;
  div_t dVar3;
  undefined4 in_register_00000034;
  undefined1 local_38 [8];
  CArbitraryInteger result;
  CArbitraryInteger *operand_local;
  CArbitraryInteger *this_local;
  
  result._24_8_ = CONCAT44(in_register_00000034,__numer);
  bVar1 = IsZero((CArbitraryInteger *)result._24_8_);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!operand.IsZero()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/ArbitraryInteger.cpp"
                  ,0x19a,"void Refal2::CArbitraryInteger::div(CArbitraryInteger &)");
  }
  bVar1 = IsZero(this);
  if (bVar1) {
    Zero((CArbitraryInteger *)result._24_8_);
    dVar3 = extraout_RAX;
  }
  else {
    TVar2 = compare(this,(CArbitraryInteger *)result._24_8_);
    if (TVar2 == CR_Less) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::swap
                (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)result._24_8_);
      Zero(this);
      dVar3 = extraout_RAX_00;
    }
    else if (TVar2 == CR_Equal) {
      Zero(this);
      AddDigit(this,1);
      Zero((CArbitraryInteger *)result._24_8_);
      dVar3 = extraout_RAX_01;
    }
    else {
      if (TVar2 != CR_Great) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/ArbitraryInteger.cpp"
                      ,0x1b4,"void Refal2::CArbitraryInteger::div(CArbitraryInteger &)");
      }
      CArbitraryInteger((CArbitraryInteger *)local_38);
      calculateDiv(this,(CArbitraryInteger *)result._24_8_,(CArbitraryInteger *)local_38);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::swap
                (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)result._24_8_);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::swap
                (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
      ~CArbitraryInteger((CArbitraryInteger *)local_38);
      dVar3 = extraout_RAX_02;
    }
  }
  return dVar3;
}

Assistant:

void CArbitraryInteger::div( CArbitraryInteger& operand )
{
	assert( !operand.IsZero() );
	if( IsZero() ) {
		// 0 / ...
		operand.Zero();
	} else {
		switch( compare( operand ) ) {
			case CR_Less:
				// x / y, where x < y
				swap( operand );
				Zero();
				break;
			case CR_Equal:
				Zero();
				AddDigit( 1 );
				operand.Zero();
				break;
			case CR_Great:
			{
				// x > y > 0
				CArbitraryInteger result;
				calculateDiv( operand, result );
				swap( operand );
				swap( result );
				break;
			}
			default:
				assert( false );
				break;
		}
	}
}